

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void __thiscall
Args::HelpPrinter::printOnlyFor
          (HelpPrinter *this,ArgIface *arg,OutStreamType *to,size_type beforeDescription,
          size_type param_4)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  size_type currentPos;
  StringList local_50;
  
  iVar2 = (*arg->_vptr_ArgIface[7])(arg);
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 8) == 0) {
    currentPos = 4;
    printOffset(to,0,4);
  }
  else {
    std::operator<<(to,' ');
    poVar3 = std::operator<<(to,'-');
    iVar2 = (*arg->_vptr_ArgIface[7])(arg);
    std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*arg->_vptr_ArgIface[7])(arg);
    lVar1 = *(long *)(CONCAT44(extraout_var_01,iVar2) + 8);
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_02,iVar2) + 8) == 0) {
      iVar2 = (*arg->_vptr_ArgIface[4])(arg);
      if ((char)iVar2 == '\0') {
        currentPos = lVar1 + 2;
      }
      else {
        poVar3 = std::operator<<(to," <");
        iVar2 = (*arg->_vptr_ArgIface[9])(arg);
        poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_03,iVar2));
        std::operator<<(poVar3,'>');
        iVar2 = (*arg->_vptr_ArgIface[9])(arg);
        currentPos = lVar1 + *(long *)(CONCAT44(extraout_var_04,iVar2) + 8) + 5;
      }
    }
    else {
      std::operator<<(to,',');
      currentPos = lVar1 + 3;
    }
  }
  iVar2 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_05,iVar2) + 8) == 0) {
    iVar2 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_10,iVar2) + 8) != 0) goto LAB_00108ed1;
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_11,iVar2) + 8) != 0) goto LAB_00108ed1;
    std::operator<<(to,' ');
    (*arg->_vptr_ArgIface[3])((string *)&local_50,arg);
    std::operator<<(to,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    (*arg->_vptr_ArgIface[3])((string *)&local_50,arg);
    currentPos = (long)&((local_50.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                 currentPos + 1;
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::operator<<(to,' ');
    poVar3 = std::operator<<(to,"--");
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    std::operator<<(poVar3,(string *)CONCAT44(extraout_var_06,iVar2));
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    currentPos = currentPos + *(long *)(CONCAT44(extraout_var_07,iVar2) + 8) + 3;
  }
  iVar2 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar2 != '\0') {
    poVar3 = std::operator<<(to," <");
    iVar2 = (*arg->_vptr_ArgIface[9])(arg);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_08,iVar2));
    std::operator<<(poVar3,'>');
    iVar2 = (*arg->_vptr_ArgIface[9])(arg);
    currentPos = currentPos + *(long *)(CONCAT44(extraout_var_09,iVar2) + 8) + 3;
  }
LAB_00108ed1:
  iVar2 = (*arg->_vptr_ArgIface[10])(arg);
  splitToWords(&local_50,this,(String *)CONCAT44(extraout_var_12,iVar2));
  printString(this,to,&local_50,currentPos,beforeDescription,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  poVar3 = std::operator<<(to,"\n");
  std::operator<<(poVar3,"\n");
  std::ostream::flush();
  return;
}

Assistant:

inline void
HelpPrinter::printOnlyFor( ArgIface * arg, OutStreamType & to,
	String::size_type beforeDescription, String::size_type ) const
{
	String::size_type pos = 0;

	if( !arg->flag().empty() )
	{
		to << ' ';
		++pos;
		to << '-' << arg->flag();
		pos += arg->flag().length() + 1;

		if( !arg->argumentName().empty() )
		{
			to << ',';
			++pos;
		}
		else if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}
	else
	{
		printOffset( to, pos, 4 );
		pos = 4;
	}

	if( !arg->argumentName().empty() )
	{
		to << ' ';
		++pos;
		to << "--" << arg->argumentName();
		pos += arg->argumentName().length() + 2;

		if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
	{
		to << ' ';
		++pos;
		to << arg->name();
		pos += arg->name().length();

		if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}

	printString( to, splitToWords( arg->description() ), pos,
		beforeDescription, 0 );

	to << "\n" << "\n";

	to.flush();
}